

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O3

void CGL::Misc::draw_sphere_wireframe_opengl(Vector3D *p,double r,Color *c)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (initialized == '\0') {
    init_mesh();
    initialized = '\x01';
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated((p->field_0).field_0.x,(p->field_0).field_0.y,(p->field_0).field_0.z);
  glScaled(r,r,r);
  uVar3 = 0xfffffffffffffffd;
  do {
    glBegin(2);
    uVar1 = Indices[uVar3 + 4];
    uVar2 = Indices[uVar3 + 5];
    glVertex3dv((ulong)(Indices[uVar3 + 3] << 3) * 8 + 0x2adbd8);
    glVertex3dv((ulong)(uVar1 << 3) * 8 + 0x2adbd8);
    glVertex3dv((ulong)(uVar2 << 3) * 8 + 0x2adbd8);
    glEnd();
    uVar3 = uVar3 + 3;
  } while (uVar3 < 0xbb7d);
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere_wireframe_opengl(const Vector3D& p, double r, const Color& c) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_LINE_LOOP);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  glPopMatrix();

}